

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O2

void av1_fdct8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [12];
  long lVar6;
  undefined7 in_register_00000011;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int32_t step [8];
  
  av1_range_check_buf(0,input,input,8,*stage_range);
  *output = input[7] + *input;
  output[1] = input[6] + input[1];
  output[2] = input[5] + input[2];
  output[3] = input[4] + input[3];
  output[4] = input[3] - input[4];
  output[5] = input[2] - input[5];
  output[6] = input[1] - input[6];
  output[7] = *input - input[7];
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  lVar6 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  iVar1 = *output;
  iVar2 = output[1];
  iVar3 = output[2];
  iVar4 = output[3];
  auVar9._4_4_ = iVar3;
  auVar9._0_4_ = iVar4;
  auVar9._8_4_ = iVar2;
  auVar9._12_4_ = iVar1;
  step[0] = iVar4 + iVar1;
  step[1] = iVar3 + iVar2;
  auVar5._4_8_ = auVar9._8_8_;
  auVar5._0_4_ = iVar3 - iVar2;
  auVar10._0_8_ = auVar5._0_8_ << 0x20;
  auVar10._8_4_ = iVar2 - iVar3;
  auVar10._12_4_ = iVar1 - iVar4;
  step._8_8_ = auVar10._8_8_;
  step[4] = output[4];
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1e0);
  lVar8 = 1L << (cos_bit - 1U & 0x3f);
  lVar7 = (long)output[6] * (long)iVar1 + lVar8;
  step[5] = (int32_t)(output[5] * -iVar1 + lVar7 >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(output[5] * iVar1 + lVar7 >> (cos_bit & 0x3fU));
  step[7] = output[7];
  av1_range_check_buf(2,input,step,8,stage_range[2]);
  lVar7 = (long)step[0] * (long)iVar1 + lVar8;
  *output = (int32_t)(step[1] * iVar1 + lVar7 >> (cos_bit & 0x3fU));
  output[1] = (int32_t)(-iVar1 * step[1] + lVar7 >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x220);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1a0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x180);
  output[2] = (int32_t)(step[2] * iVar1 + lVar8 + (long)(step[3] * iVar2) >> (cos_bit & 0x3fU));
  output[3] = (int32_t)(step[3] * iVar1 + lVar8 + (long)-(step[2] * iVar2) >> (cos_bit & 0x3fU));
  output[4] = step[5] + step[4];
  output[5] = step[4] - step[5];
  output[6] = step[7] - step[6];
  output[7] = step[6] + step[7];
  av1_range_check_buf(3,input,output,8,stage_range[3]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x240);
  step[4] = (int32_t)(output[4] * iVar1 + lVar8 + (long)(output[7] * iVar3) >> (cos_bit & 0x3fU));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x200);
  step[5] = (int32_t)(output[5] * iVar2 + lVar8 + (long)(output[6] * iVar4) >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(output[6] * iVar2 + lVar8 + (long)-(output[5] * iVar4) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(output[7] * iVar1 + lVar8 + (long)-(output[4] * iVar3) >> (cos_bit & 0x3fU));
  av1_range_check_buf(4,input,step,8,stage_range[4]);
  *(ulong *)(output + 4) = CONCAT44(step[5],step[1]);
  output[8] = step[3];
  output[9] = step[7];
  *output = step[0];
  output[1] = step[4];
  output[2] = step[2];
  output[3] = step[6];
  av1_range_check_buf(5,input,output,8,stage_range[5]);
  return;
}

Assistant:

void av1_fdct8(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  const int32_t size = 8;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[7];
  bf1[1] = input[1] + input[6];
  bf1[2] = input[2] + input[5];
  bf1[3] = input[3] + input[4];
  bf1[4] = -input[4] + input[3];
  bf1[5] = -input[5] + input[2];
  bf1[6] = -input[6] + input[1];
  bf1[7] = -input[7] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0] + bf0[3];
  bf1[1] = bf0[1] + bf0[2];
  bf1[2] = -bf0[2] + bf0[1];
  bf1[3] = -bf0[3] + bf0[0];
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[5], cos_bit);
  bf1[7] = bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  bf1[4] = bf0[4] + bf0[5];
  bf1[5] = -bf0[5] + bf0[4];
  bf1[6] = -bf0[6] + bf0[7];
  bf1[7] = bf0[7] + bf0[6];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[24], bf0[6], -cospi[40], bf0[5], cos_bit);
  bf1[7] = half_btf(cospi[56], bf0[7], -cospi[8], bf0[4], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[4];
  bf1[2] = bf0[2];
  bf1[3] = bf0[6];
  bf1[4] = bf0[1];
  bf1[5] = bf0[5];
  bf1[6] = bf0[3];
  bf1[7] = bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}